

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairing.c
# Opt level: O0

int compute_6tplus2_naf(int **naf,int *naf_len,fp_struct_st *t)

{
  int iVar1;
  int iVar2;
  BIGNUM *a;
  int *in_RSI;
  undefined8 *in_RDI;
  bool bVar3;
  BIGNUM *z;
  int *ret;
  int *tmp;
  int j;
  int i;
  int bits;
  unsigned_long *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  void *local_40;
  int *local_38;
  int local_2c;
  int local_28;
  
  local_38 = (int *)0x0;
  local_40 = (void *)0x0;
  a = BN_new();
  if (a != (BIGNUM *)0x0) {
    BN_set_words((BIGNUM *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8,0);
    BN_mul_word(a,6);
    BN_add_word(a,2);
    iVar1 = BN_num_bits(a);
    if (0 < iVar1) {
      local_38 = (int *)CRYPTO_zalloc(CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0))
      ;
      local_40 = CRYPTO_zalloc(CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      if ((local_38 != (int *)0x0) && (local_40 != (void *)0x0)) {
        for (local_28 = 0; iVar2 = iVar1, local_28 < iVar1; local_28 = local_28 + 1) {
          iVar2 = BN_is_bit_set(a,iVar1 - local_28);
          local_38[local_28] = iVar2;
        }
        while (local_28 = iVar2, 0 < local_28) {
          local_2c = local_28;
          while( true ) {
            bVar3 = false;
            if (0 < local_2c) {
              bVar3 = local_38[local_2c] == 1;
            }
            if (!bVar3) break;
            local_2c = local_2c + -1;
          }
          if ((local_2c == 0) && (2 < local_28)) {
            local_38[local_28] = -1;
            while (local_28 = local_28 + -1, 0 < local_28) {
              local_38[local_28] = 0;
            }
            local_38[local_28] = 1;
          }
          if (local_28 - local_2c < 2) {
            iVar2 = local_28 + -1;
          }
          else {
            local_38[local_28] = -1;
            while (local_28 = local_28 + -1, local_2c < local_28) {
              local_38[local_28] = 0;
            }
            local_38[local_28] = 1;
            iVar2 = local_28;
          }
        }
        if (*local_38 == 1) {
          memcpy(local_40,local_38,(long)(iVar1 + 1) << 2);
          *in_RDI = local_40;
          *in_RSI = iVar1 + 1;
        }
        else {
          memcpy(local_40,local_38 + 1,(long)iVar1 << 2);
          *in_RDI = local_40;
          *in_RSI = iVar1;
        }
        CRYPTO_free(local_38);
        BN_free(a);
        return 1;
      }
    }
  }
  *in_RDI = 0;
  *in_RSI = 0;
  CRYPTO_free(local_38);
  CRYPTO_free(local_40);
  BN_free(a);
  return 0;
}

Assistant:

int compute_6tplus2_naf(int **naf, int *naf_len, fp_t t)
{
    int bits, i, j;
    int *tmp = NULL;
    int *ret = NULL;
    BIGNUM *z = NULL;

    z = BN_new();
    if (z == NULL)
        goto end;

    BN_set_words(z, t->d, N_LIMBS);
    BN_mul_word(z, 6);
    BN_add_word(z, 2);
    bits = BN_num_bits(z);
    if (bits <= 0)
        goto end;

    tmp = (int*)CRYPTO_zalloc((bits + 1) * sizeof(int));
    ret = (int*)CRYPTO_zalloc((bits + 1) * sizeof(int));
    if (tmp == NULL || ret == NULL)
        goto end;

    for (i = 0; i < bits; i++)
        tmp[i] = BN_is_bit_set(z, bits - i);

    i = bits;
    while (i > 0) {
        j = i;
        while (j > 0 && tmp[j] == 1)
            j--;

        if (j == 0) {
            if ((i - j) >= 3) {
                tmp[i] = -1;
                i--;
                while (i > j) {
                    tmp[i] = 0;
                    i--;
                }
                tmp[i] = 1;
            }
        }

        /* ***11*** --> **10-1*** */
        if ((i - j) >= 2) {
            tmp[i] = -1;
            i--;
            while (i > j) {
                tmp[i] = 0;
                i--;
            }
            tmp[i] = 1;
        }
        else
            i--;
    }

    if (tmp[0] == 1) {
        memcpy(ret, tmp, (bits + 1) * sizeof(int));
        *naf = ret;
        *naf_len = (bits + 1);
    }
    else {
        memcpy(ret, tmp + 1, bits * sizeof(int));
        *naf = ret;
        *naf_len = bits;
    }

    CRYPTO_free(tmp);
    BN_free(z);
    return GML_OK;
end:
    *naf = NULL;
    *naf_len = 0;
    CRYPTO_free(tmp);
    CRYPTO_free(ret);
    BN_free(z);
    return GML_ERROR;
}